

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O1

void __thiscall SGP4::Initialise(SGP4 *this)

{
  double *sinio;
  double *pdVar1;
  double dVar2;
  double __x;
  SatelliteException *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double __x_00;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_20;
  
  this->use_simple_model_ = false;
  this->use_deep_space_ = false;
  memset(this,0,0x268);
  dVar9 = (this->elements_).eccentricity_;
  if ((dVar9 < 0.0) || (0.999 < dVar9)) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Eccentricity out of range");
  }
  else {
    dVar9 = (this->elements_).inclination_;
    if ((0.0 <= dVar9) && (dVar9 <= 3.141592653589793)) {
      sinio = &(this->common_consts_).sinio;
      RecomputeConstants(dVar9,sinio,(double *)this,&(this->common_consts_).x3thm1,
                         &(this->common_consts_).x1mth2,&(this->common_consts_).x7thm1,
                         &(this->common_consts_).xlcof,&(this->common_consts_).aycof);
      dVar9 = (this->common_consts_).cosio;
      dVar12 = (this->elements_).eccentricity_;
      dVar12 = dVar12 * dVar12;
      dVar3 = 1.0 - dVar12;
      if (dVar3 < 0.0) {
        dVar4 = sqrt(dVar3);
      }
      else {
        dVar4 = SQRT(dVar3);
      }
      if (225.0 <= (this->elements_).period_) {
        this->use_deep_space_ = true;
      }
      else {
        this->use_simple_model_ = false;
        this->use_deep_space_ = false;
        pdVar1 = &(this->elements_).perigee_;
        if (*pdVar1 <= 220.0 && *pdVar1 != 220.0) {
          this->use_simple_model_ = true;
        }
      }
      dVar9 = dVar9 * dVar9;
      dVar10 = (this->elements_).perigee_;
      if (156.0 <= dVar10) {
        local_20 = kQOMS2T;
        dVar10 = 1.0122292801892716;
      }
      else {
        dVar10 = (double)(~-(ulong)(dVar10 < 98.0) & (ulong)(dVar10 + -78.0) |
                         (ulong)((uint)(-(ulong)(dVar10 < 98.0) >> 0x20) & 0x40340000) << 0x20);
        local_20 = pow((120.0 - dVar10) / 6378.135,4.0);
        dVar10 = dVar10 / 6378.135 + 1.0;
      }
      dVar17 = (this->elements_).eccentricity_;
      dVar8 = (this->elements_).recovered_semi_major_axis_;
      dVar13 = 1.0 / (dVar8 * dVar8 * dVar3 * dVar3);
      __x_00 = 1.0 / (dVar8 - dVar10);
      dVar15 = dVar8 * dVar17 * __x_00;
      (this->common_consts_).eta = dVar15;
      dVar17 = dVar17 * dVar15;
      dVar15 = dVar15 * dVar15;
      __x = ABS(1.0 - dVar15);
      dVar5 = pow(__x_00,4.0);
      dVar5 = dVar5 * local_20;
      dVar6 = pow(__x,3.5);
      dVar6 = dVar5 / dVar6;
      dVar8 = (this->elements_).recovered_mean_motion_;
      dVar16 = (this->elements_).recovered_semi_major_axis_;
      dVar11 = (this->common_consts_).x1mth2;
      dVar2 = (this->common_consts_).x3thm1;
      (this->common_consts_).c1 =
           (((dVar15 + 4.0) * dVar17 + dVar15 * 1.5 + 1.0) * dVar16 +
           ((dVar15 + 8.0) * dVar15 * 3.0 + 8.0) * ((__x_00 * 0.00040598100000000003) / __x) * dVar2
           ) * dVar6 * dVar8 * (this->elements_).bstar_;
      dVar14 = (this->elements_).eccentricity_;
      dVar18 = (this->common_consts_).eta;
      dVar7 = (this->elements_).argument_perigee_;
      dVar7 = cos(dVar7 + dVar7);
      (this->common_consts_).c4 =
           (((__x_00 * -0.001082616) / (__x * dVar16)) *
            (dVar7 * ((dVar15 + dVar15) - (dVar15 + 1.0) * dVar17) * dVar11 * 0.75 +
            ((dVar17 * -0.5 + 1.5) * dVar15 + (1.0 - (dVar17 + dVar17))) * dVar2 * -3.0) +
           (dVar15 * 0.5 + 2.0) * dVar18 + (dVar15 + dVar15 + 0.5) * dVar14) *
           (dVar8 + dVar8) * dVar6 * dVar16 * dVar3;
      dVar18 = dVar9 * dVar9;
      dVar8 = (this->elements_).recovered_mean_motion_;
      dVar2 = dVar13 * 0.0016239240000000001 * dVar8;
      dVar14 = dVar2 * 0.000541308 * dVar13;
      dVar16 = dVar14 * 0.0625;
      dVar7 = (dVar18 * 137.0 + dVar9 * -78.0 + 13.0) * dVar4 * dVar16 +
              dVar2 * 0.5 * dVar4 * (this->common_consts_).x3thm1 + dVar8;
      dVar11 = dVar13 * 7.762359374999998e-07 * dVar13 * dVar8;
      dVar18 = (dVar18 * 49.0 + dVar9 * -36.0 + 3.0) * dVar11 +
               (dVar18 * 395.0 + dVar9 * -114.0 + 7.0) * dVar16 +
               dVar2 * -0.5 * (dVar9 * -5.0 + 1.0);
      (this->common_consts_).xmdot = dVar7;
      (this->common_consts_).omgdot = dVar18;
      dVar16 = (this->common_consts_).cosio;
      dVar14 = ((dVar9 * -7.0 + 3.0) * (dVar11 + dVar11) + (dVar9 * -19.0 + 4.0) * dVar14 * 0.5) *
               dVar16 + -dVar2 * dVar16;
      dVar11 = (this->common_consts_).c1;
      (this->common_consts_).xnodot = dVar14;
      (this->common_consts_).xnodcf = dVar3 * 3.5 * -dVar2 * dVar16 * dVar11;
      (this->common_consts_).t2cof = dVar11 * 1.5;
      if (this->use_deep_space_ == true) {
        dVar10 = (double)(this->elements_).epoch_.m_encoded / 86400000000.0 + 1721425.5;
        dVar8 = floor(dVar10 + 0.5);
        dVar17 = (dVar8 + -0.5 + -2451545.0) / 36525.0;
        dVar10 = ((((dVar10 - (dVar8 + -0.5)) * 1.00273790935 * 86400.0 +
                   ((dVar17 * -6.2e-06 + 0.093104) * dVar17 + 8640184.812866) * dVar17 + 24110.54841
                   ) / 240.0) * 3.141592653589793) / 180.0;
        dVar17 = floor(dVar10 / 6.283185307179586);
        (this->deepspace_consts_).gsto = dVar17 * -6.283185307179586 + dVar10;
        DeepSpaceInitialise(this,dVar12,(this->common_consts_).sinio,dVar16,dVar4,dVar9,dVar3,dVar7,
                            dVar18,dVar14);
      }
      else {
        dVar9 = (this->elements_).eccentricity_;
        dVar12 = 0.0;
        if (0.0001 < dVar9) {
          dVar12 = (__x_00 * dVar5 * 0.004690139440023056 * dVar8 * *sinio) / dVar9;
        }
        (this->nearspace_consts_).c5 =
             ((dVar15 + dVar17) * 2.75 + 1.0 + dVar17 * dVar15) *
             dVar3 * (dVar6 + dVar6) * (this->elements_).recovered_semi_major_axis_;
        dVar9 = (this->elements_).bstar_;
        dVar3 = cos((this->elements_).argument_perigee_);
        (this->nearspace_consts_).omgcof = dVar3 * dVar12 * dVar9;
        (this->nearspace_consts_).xmcof = 0.0;
        if (0.0001 < (this->elements_).eccentricity_) {
          (this->nearspace_consts_).xmcof =
               (dVar5 * -0.6666666666666666 * (this->elements_).bstar_) / dVar17;
        }
        dVar9 = (this->common_consts_).eta;
        dVar12 = cos((this->elements_).mean_anomoly_);
        dVar9 = pow(dVar12 * dVar9 + 1.0,3.0);
        (this->nearspace_consts_).delmo = dVar9;
        dVar9 = sin((this->elements_).mean_anomoly_);
        (this->nearspace_consts_).sinmo = dVar9;
        if (this->use_simple_model_ == false) {
          dVar9 = (this->common_consts_).c1;
          dVar3 = dVar9 * dVar9;
          dVar12 = (this->elements_).recovered_semi_major_axis_;
          dVar4 = dVar12 * 4.0 * __x_00 * dVar3;
          (this->nearspace_consts_).d2 = dVar4;
          dVar8 = (__x_00 * dVar4 * dVar9) / 3.0;
          dVar17 = (dVar12 * 17.0 + dVar10) * dVar8;
          (this->nearspace_consts_).d3 = dVar17;
          dVar12 = (dVar12 * 221.0 + dVar10 * 31.0) * dVar8 * 0.5 * dVar12 * __x_00 * dVar9;
          (this->nearspace_consts_).d4 = dVar12;
          (this->nearspace_consts_).t3cof = dVar3 + dVar3 + dVar4;
          (this->nearspace_consts_).t4cof =
               (dVar17 * 3.0 + (dVar4 * 12.0 + dVar3 * 10.0) * dVar9) * 0.25;
          (this->nearspace_consts_).t5cof =
               ((dVar4 + dVar4 + dVar3) * dVar3 * 15.0 +
               dVar4 * 6.0 * dVar4 + dVar12 * 3.0 + dVar9 * 12.0 * dVar17) * 0.2;
        }
      }
      return;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Inclination out of range");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SGP4::Initialise()
{
    /*
     * reset all constants etc
     */
    Reset();

    /*
     * error checks
     */
    if (elements_.Eccentricity() < 0.0 || elements_.Eccentricity() > 0.999)
    {
        throw SatelliteException("Eccentricity out of range");
    }

    if (elements_.Inclination() < 0.0 || elements_.Inclination() > kPI)
    {
        throw SatelliteException("Inclination out of range");
    }

    RecomputeConstants(elements_.Inclination(),
                       common_consts_.sinio,
                       common_consts_.cosio,
                       common_consts_.x3thm1,
                       common_consts_.x1mth2,
                       common_consts_.x7thm1,
                       common_consts_.xlcof,
                       common_consts_.aycof);

    const double theta2 = common_consts_.cosio * common_consts_.cosio;
    const double eosq = elements_.Eccentricity() * elements_.Eccentricity();
    const double betao2 = 1.0 - eosq;
    const double betao = sqrt(betao2);

    if (elements_.Period() >= 225.0)
    {
        use_deep_space_ = true;
    }
    else
    {
        use_deep_space_ = false;
        use_simple_model_ = false;
        /*
         * for perigee less than 220 kilometers, the simple_model flag is set
         * and the equations are truncated to linear variation in sqrt a and
         * quadratic variation in mean anomly. also, the c3 term, the
         * delta omega term and the delta m term are dropped
         */
        if (elements_.Perigee() < 220.0)
        {
            use_simple_model_ = true;
        }
    }

    /*
     * for perigee below 156km, the values of
     * s4 and qoms2t are altered
     */
    double s4 = kS;
    double qoms24 = kQOMS2T;
    if (elements_.Perigee() < 156.0)
    {
        s4 = elements_.Perigee() - 78.0;
        if (elements_.Perigee() < 98.0) 
        {
            s4 = 20.0;
        }
        qoms24 = pow((120.0 - s4) * kAE / kXKMPER, 4.0);
        s4 = s4 / kXKMPER + kAE;
    }

    /*
     * generate constants
     */
    const double pinvsq = 1.0
        / (elements_.RecoveredSemiMajorAxis()
                * elements_.RecoveredSemiMajorAxis()
                * betao2 * betao2);
    const double tsi = 1.0 / (elements_.RecoveredSemiMajorAxis() - s4);
    common_consts_.eta = elements_.RecoveredSemiMajorAxis()
        * elements_.Eccentricity() * tsi;
    const double etasq = common_consts_.eta * common_consts_.eta;
    const double eeta = elements_.Eccentricity() * common_consts_.eta;
    const double psisq = fabs(1.0 - etasq);
    const double coef = qoms24 * pow(tsi, 4.0);
    const double coef1 = coef / pow(psisq, 3.5);
    const double c2 = coef1 * elements_.RecoveredMeanMotion()
        * (elements_.RecoveredSemiMajorAxis()
        * (1.0 + 1.5 * etasq + eeta * (4.0 + etasq))
        + 0.75 * kCK2 * tsi / psisq * common_consts_.x3thm1
        * (8.0 + 3.0 * etasq * (8.0 + etasq)));
    common_consts_.c1 = elements_.BStar() * c2;
    common_consts_.c4 = 2.0 * elements_.RecoveredMeanMotion()
        * coef1 * elements_.RecoveredSemiMajorAxis() * betao2
        * (common_consts_.eta * (2.0 + 0.5 * etasq) + elements_.Eccentricity()
        * (0.5 + 2.0 * etasq)
        - 2.0 * kCK2 * tsi / (elements_.RecoveredSemiMajorAxis() * psisq)
        * (-3.0 * common_consts_.x3thm1 * (1.0 - 2.0 * eeta + etasq
        * (1.5 - 0.5 * eeta))
        + 0.75 * common_consts_.x1mth2 * (2.0 * etasq - eeta *
            (1.0 + etasq)) * cos(2.0 * elements_.ArgumentPerigee())));
    const double theta4 = theta2 * theta2;
    const double temp1 = 3.0 * kCK2 * pinvsq * elements_.RecoveredMeanMotion();
    const double temp2 = temp1 * kCK2 * pinvsq;
    const double temp3 = 1.25 * kCK4 * pinvsq * pinvsq * elements_.RecoveredMeanMotion();
    common_consts_.xmdot = elements_.RecoveredMeanMotion() + 0.5 * temp1 * betao *
            common_consts_.x3thm1 + 0.0625 * temp2 * betao *
            (13.0 - 78.0 * theta2 + 137.0 * theta4);
    const double x1m5th = 1.0 - 5.0 * theta2;
    common_consts_.omgdot = -0.5 * temp1 * x1m5th +
            0.0625 * temp2 * (7.0 - 114.0 * theta2 + 395.0 * theta4) +
            temp3 * (3.0 - 36.0 * theta2 + 49.0 * theta4);
    const double xhdot1 = -temp1 * common_consts_.cosio;
    common_consts_.xnodot = xhdot1 + (0.5 * temp2 * (4.0 - 19.0 * theta2) + 2.0 * temp3 *
            (3.0 - 7.0 * theta2)) * common_consts_.cosio;
    common_consts_.xnodcf = 3.5 * betao2 * xhdot1 * common_consts_.c1;
    common_consts_.t2cof = 1.5 * common_consts_.c1;

    if (use_deep_space_)
    {
        deepspace_consts_.gsto = elements_.Epoch().ToGreenwichSiderealTime();

        DeepSpaceInitialise(eosq,
                            common_consts_.sinio,
                            common_consts_.cosio,
                            betao,
                            theta2,
                            betao2,
                            common_consts_.xmdot,
                            common_consts_.omgdot,
                            common_consts_.xnodot);
    }
    else
    {
        double c3 = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            c3 = coef * tsi * kA3OVK2 * elements_.RecoveredMeanMotion() * kAE *
                    common_consts_.sinio / elements_.Eccentricity();
        }

        nearspace_consts_.c5 = 2.0 * coef1 * elements_.RecoveredSemiMajorAxis() * betao2 * (1.0 + 2.75 *
                (etasq + eeta) + eeta * etasq);
        nearspace_consts_.omgcof = elements_.BStar() * c3 * cos(elements_.ArgumentPerigee());

        nearspace_consts_.xmcof = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            nearspace_consts_.xmcof = -kTWOTHIRD * coef * elements_.BStar() * kAE / eeta;
        }

        nearspace_consts_.delmo = pow(1.0 + common_consts_.eta * (cos(elements_.MeanAnomoly())), 3.0);
        nearspace_consts_.sinmo = sin(elements_.MeanAnomoly());

        if (!use_simple_model_)
        {
            const double c1sq = common_consts_.c1 * common_consts_.c1;
            nearspace_consts_.d2 = 4.0 * elements_.RecoveredSemiMajorAxis() * tsi * c1sq;
            const double temp = nearspace_consts_.d2 * tsi * common_consts_.c1 / 3.0;
            nearspace_consts_.d3 = (17.0 * elements_.RecoveredSemiMajorAxis() + s4) * temp;
            nearspace_consts_.d4 = 0.5 * temp * elements_.RecoveredSemiMajorAxis() *
                    tsi * (221.0 * elements_.RecoveredSemiMajorAxis() + 31.0 * s4) * common_consts_.c1;
            nearspace_consts_.t3cof = nearspace_consts_.d2 + 2.0 * c1sq;
            nearspace_consts_.t4cof = 0.25 * (3.0 * nearspace_consts_.d3 + common_consts_.c1 *
                    (12.0 * nearspace_consts_.d2 + 10.0 * c1sq));
            nearspace_consts_.t5cof = 0.2 * (3.0 * nearspace_consts_.d4 + 12.0 * common_consts_.c1 *
                    nearspace_consts_.d3 + 6.0 * nearspace_consts_.d2 * nearspace_consts_.d2 + 15.0 *
                    c1sq * (2.0 * nearspace_consts_.d2 + c1sq));
        }
    }
}